

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtEnv.c
# Opt level: O3

void NewtCleanup(void)

{
  if (newt_env.pool != (newtPool)0x0) {
    NewtPoolRelease(newt_env.pool);
    NewtMemFree(newt_env.pool);
    newt_env.pool = (newtPool)0x0;
  }
  return;
}

Assistant:

void NewtCleanup(void)
{
    // 後始末をすること
    
    // メモリプールの解放
    if (NEWT_POOL != NULL)
    {
        NewtPoolRelease(NEWT_POOL);
        NewtMemFree(NEWT_POOL);
        NEWT_POOL = NULL;
    }
}